

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to4_avx
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  ulong uVar8;
  uint _w;
  long lVar9;
  ulong uVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  void *pvVar13;
  void *pvVar14;
  undefined4 *puVar15;
  int i;
  long lVar16;
  long lVar17;
  ulong local_b0;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar10 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar6 = inch + 7;
  if (-1 < inch) {
    iVar6 = inch;
  }
  iVar5 = outch + 7;
  if (-1 < outch) {
    iVar5 = outch;
  }
  cVar4 = (char)(outch % 8);
  Mat::create(kernel_tm,_w * 0x40,iVar6 >> 3,
              (int)((char)(((byte)(cVar4 >> 7) >> 6) + cVar4) >> 2) + (iVar5 >> 3),4,
              (Allocator *)0x0);
  if (7 < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    local_b0 = 0;
    do {
      if (7 < inch) {
        pvVar13 = (void *)((local_b0 >> 3) * sVar2 * sVar3 + (long)pvVar1);
        puVar11 = (undefined4 *)
                  (local_78.cstep * local_78.elemsize * local_b0 + (long)local_78.data);
        lVar9 = 0;
        do {
          if (0 < (int)_w) {
            uVar10 = 0;
            puVar7 = puVar11;
            do {
              lVar16 = 0;
              puVar12 = puVar7;
              do {
                pvVar14 = pvVar13;
                lVar17 = 0;
                puVar15 = puVar12;
                do {
                  *(undefined4 *)((long)pvVar14 + lVar17) = *puVar15;
                  puVar15 = (undefined4 *)((long)puVar15 + local_78.cstep * local_78.elemsize);
                  lVar17 = lVar17 + 4;
                } while (lVar17 != 0x20);
                lVar16 = lVar16 + 1;
                puVar12 = (undefined4 *)((long)puVar12 + (long)local_78.w * local_78.elemsize);
                pvVar13 = (void *)((long)pvVar14 + 0x20);
              } while (lVar16 != 8);
              uVar10 = uVar10 + 1;
              puVar7 = puVar7 + 1;
              pvVar13 = (void *)((long)pvVar14 + 0x20);
            } while (uVar10 != _w);
            pvVar13 = (void *)((long)pvVar14 + 0x20);
          }
          lVar16 = lVar9 + 0xf;
          puVar11 = puVar11 + (long)local_78.w * local_78.elemsize * 2;
          lVar9 = lVar9 + 8;
        } while (lVar16 < inch);
      }
      uVar10 = local_b0 + 8;
      uVar8 = local_b0 + 0xf;
      local_b0 = uVar10;
    } while (uVar8 < (uint)outch);
  }
  if ((int)((uint)uVar10 | 3) < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    local_b0 = uVar10 & 0xffffffff;
    do {
      if (7 < inch) {
        pvVar13 = (void *)((ulong)(((uint)(local_b0 >> 3) & 0x1fffffff) +
                                  (uint)(((uint)local_b0 >> 2 & 1) != 0)) * sVar2 * sVar3 +
                          (long)pvVar1);
        puVar11 = (undefined4 *)
                  (local_78.cstep * local_78.elemsize * local_b0 + (long)local_78.data);
        lVar9 = 0;
        do {
          if (0 < (int)_w) {
            uVar10 = 0;
            puVar7 = puVar11;
            do {
              lVar16 = 0;
              puVar12 = puVar7;
              do {
                pvVar14 = pvVar13;
                lVar17 = 0;
                puVar15 = puVar12;
                do {
                  *(undefined4 *)((long)pvVar14 + lVar17) = *puVar15;
                  puVar15 = (undefined4 *)((long)puVar15 + local_78.cstep * local_78.elemsize);
                  lVar17 = lVar17 + 4;
                } while (lVar17 != 0x10);
                lVar16 = lVar16 + 1;
                puVar12 = (undefined4 *)((long)puVar12 + (long)local_78.w * local_78.elemsize);
                pvVar13 = (void *)((long)pvVar14 + 0x10);
              } while (lVar16 != 8);
              uVar10 = uVar10 + 1;
              puVar7 = puVar7 + 1;
              pvVar13 = (void *)((long)pvVar14 + 0x10);
            } while (uVar10 != _w);
            pvVar13 = (void *)((long)pvVar14 + 0x10);
          }
          lVar16 = lVar9 + 0xf;
          puVar11 = puVar11 + (long)local_78.w * local_78.elemsize * 2;
          lVar9 = lVar9 + 8;
        } while (lVar16 < inch);
      }
      local_b0 = local_b0 + 4;
    } while ((int)((uint)local_b0 | 3) < outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to4_avx(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-8a-maxk-inch/8a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(64 * maxk, inch / 8, outch / 8 + (outch % 8) / 4, (size_t)4u);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
}